

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

char * pathsearch(char *argv0,char *name,int modemask)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  char *__dest;
  char *pcVar7;
  
  pcVar3 = strrchr(argv0,0x2f);
  if (pcVar3 == (char *)0x0) {
    pcVar6 = getenv("PATH");
    pcVar3 = ".:/bin:/usr/bin";
    if (pcVar6 != (char *)0x0) {
      pcVar3 = pcVar6;
    }
    sVar4 = strlen(pcVar3);
    __dest = (char *)malloc((long)((int)sVar4 + 1));
    sVar5 = strlen(name);
    pcVar6 = (char *)malloc((long)(((ulong)(uint)((int)sVar4 + (int)sVar5) << 0x20) + 0x200000000)
                            >> 0x20);
    if ((__dest != (char *)0x0) && (pcVar6 != (char *)0x0)) {
      strcpy(__dest,pcVar3);
      pcVar3 = __dest;
      do {
        if (*pcVar3 == '\0') break;
        pcVar7 = strchr(pcVar3,0x3a);
        if (pcVar7 == (char *)0x0) {
          sVar4 = strlen(pcVar3);
          pcVar7 = pcVar3 + (int)sVar4;
        }
        cVar1 = *pcVar7;
        *pcVar7 = '\0';
        sprintf(pcVar6,"%s/%s",pcVar3,name);
        *pcVar7 = cVar1;
        if (cVar1 == '\0') {
          *pcVar3 = '\0';
        }
        else {
          pcVar3 = pcVar7 + 1;
        }
        iVar2 = access(pcVar6,modemask);
      } while (iVar2 != 0);
      free(__dest);
    }
  }
  else {
    cVar1 = *pcVar3;
    *pcVar3 = '\0';
    sVar4 = strlen(argv0);
    sVar5 = strlen(name);
    pcVar6 = (char *)malloc((long)(((ulong)(uint)((int)sVar4 + (int)sVar5) << 0x20) + 0x200000000)
                            >> 0x20);
    if (pcVar6 != (char *)0x0) {
      sprintf(pcVar6,"%s/%s",argv0,name);
    }
    *pcVar3 = cVar1;
  }
  return pcVar6;
}

Assistant:

PRIVATE char *pathsearch(char *argv0, char *name, int modemask)
{
  const char *pathlist;
  char *pathbufptr;
  char *pathbuf;
  char *path,*cp;
  char c;

#ifdef __WIN32__
  for (cp = argv0 + lemonStrlen(argv0); cp-- > argv0; )
  {
    if( *cp == '\\' || *cp == '/' )
      break;
  }
#else
  cp = strrchr(argv0,'/');
#endif
  if( cp ){
    c = *cp;
    *cp = 0;
    path = (char *)malloc( lemonStrlen(argv0) + lemonStrlen(name) + 2 );
    if( path ) sprintf(path,"%s/%s",argv0,name);
    *cp = c;
  }else{
    pathlist = getenv("PATH");
    if( pathlist==0 ) pathlist = ".:/bin:/usr/bin";
    pathbuf = (char *) malloc( lemonStrlen(pathlist) + 1 );
    path = (char *)malloc( lemonStrlen(pathlist)+lemonStrlen(name)+2 );
    if( (pathbuf != 0) && (path!=0) ){
      pathbufptr = pathbuf;
      strcpy(pathbuf, pathlist);
      while( *pathbuf ){
        cp = strchr(pathbuf,':');
        if( cp==0 ) cp = &pathbuf[lemonStrlen(pathbuf)];
        c = *cp;
        *cp = 0;
        sprintf(path,"%s/%s",pathbuf,name);
        *cp = c;
        if( c==0 ) pathbuf[0] = 0;
        else pathbuf = &cp[1];
        if( access(path,modemask)==0 ) break;
      }
      free(pathbufptr);
    }
  }
  return path;
}